

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_buffer_size_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  bool bVar1;
  long lVar2;
  SPIRVariable *var;
  CompilerError *this_00;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CompilerGLSL::to_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,id,true);
  lVar2 = ::std::__cxx11::string::find((char)&expr,0x5b);
  if (((2 < expr._M_string_length) && (*expr._M_dataplus._M_p == '(')) &&
     (expr._M_dataplus._M_p[1] == '*')) {
    CompilerGLSL::address_of_expression(&buffer_expr,&this->super_CompilerGLSL,&expr);
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&buffer_expr);
    ::std::__cxx11::string::~string((string *)&buffer_expr);
  }
  for (sVar3 = 0; expr._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    if (expr._M_dataplus._M_p[sVar3] == '.') {
      expr._M_dataplus._M_p[sVar3] = '_';
    }
  }
  if (lVar2 == -1) {
    ::std::operator+(__return_storage_ptr__,&expr,&this->buffer_size_name_suffix);
    goto LAB_001b9492;
  }
  ::std::__cxx11::string::substr((ulong)&buffer_expr,(ulong)&expr);
  ::std::__cxx11::string::substr((ulong)&array_expr,(ulong)&expr);
  var = Compiler::maybe_get_backing_variable((Compiler *)this,id);
  if (var == (SPIRVariable *)0x0) {
LAB_001b9430:
    ::std::operator+(&local_f0,&buffer_expr,&this->buffer_size_name_suffix);
    ::std::operator+(__return_storage_ptr__,&local_f0,&array_expr);
    this_01 = &local_f0;
  }
  else {
    bVar1 = is_var_runtime_size_array(this,var);
    if (!bVar1) goto LAB_001b9430;
    if ((this->msl_options).runtime_array_rich_descriptor == false) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"OpArrayLength requires rich descriptor format");
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar2 = ::std::__cxx11::string::rfind((char)&array_expr,0x5d);
    if (lVar2 == -1) goto LAB_001b9430;
    ::std::operator+(&local_50,&buffer_expr,".length(");
    ::std::__cxx11::string::substr((ulong)&local_70,(ulong)&array_expr);
    ::std::operator+(&local_f0,&local_50,&local_70);
    ::std::operator+(__return_storage_ptr__,&local_f0,")");
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_70);
    this_01 = &local_50;
  }
  ::std::__cxx11::string::~string((string *)this_01);
  ::std::__cxx11::string::~string((string *)&array_expr);
  ::std::__cxx11::string::~string((string *)&buffer_expr);
LAB_001b9492:
  ::std::__cxx11::string::~string((string *)&expr);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_buffer_size_expression(uint32_t id)
{
	auto expr = to_expression(id);
	auto index = expr.find_first_of('[');

	// This is quite crude, but we need to translate the reference name (*spvDescriptorSetN.name) to
	// the pointer expression spvDescriptorSetN.name to make a reasonable expression here.
	// This only happens if we have argument buffers and we are using OpArrayLength on a lone SSBO in that set.
	if (expr.size() >= 3 && expr[0] == '(' && expr[1] == '*')
		expr = address_of_expression(expr);

	// If a buffer is part of an argument buffer translate this to a legal identifier.
	for (auto &c : expr)
		if (c == '.')
			c = '_';

	if (index == string::npos)
		return expr + buffer_size_name_suffix;
	else
	{
		auto buffer_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		if (auto var = maybe_get_backing_variable(id))
		{
			if (is_var_runtime_size_array(*var))
			{
				if (!msl_options.runtime_array_rich_descriptor)
					SPIRV_CROSS_THROW("OpArrayLength requires rich descriptor format");

				auto last_pos = array_expr.find_last_of(']');
				if (last_pos != std::string::npos)
					return buffer_expr + ".length(" + array_expr.substr(1, last_pos - 1) + ")";
			}
		}
		return buffer_expr + buffer_size_name_suffix + array_expr;
	}
}